

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.cc
# Opt level: O0

int TVMFuncGetGlobal(char *name,TVMFunctionHandle *out)

{
  PackedFunc *pPVar1;
  runtime_error *_except_;
  allocator<char> local_49;
  string local_48;
  PackedFunc *local_28;
  PackedFunc *fp;
  TVMFunctionHandle *out_local;
  char *name_local;
  
  fp = (PackedFunc *)out;
  out_local = (TVMFunctionHandle *)name;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,name,&local_49);
  pPVar1 = tvm::runtime::Registry::Get(&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  if (pPVar1 == (PackedFunc *)0x0) {
    *(undefined8 *)&(fp->body_).super__Function_base._M_functor = 0;
  }
  else {
    local_28 = pPVar1;
    pPVar1 = (PackedFunc *)operator_new(0x20);
    tvm::runtime::PackedFunc::PackedFunc(pPVar1,local_28);
    *(PackedFunc **)&(fp->body_).super__Function_base._M_functor = pPVar1;
  }
  return 0;
}

Assistant:

int TVMFuncGetGlobal(const char *name, TVMFunctionHandle *out) {
  API_BEGIN();
  const tvm::runtime::PackedFunc *fp =
      tvm::runtime::Registry::Get(name);
  if (fp != nullptr) {
    *out = new tvm::runtime::PackedFunc(*fp); // NOLINT(*)
  } else {
    *out = nullptr;
  }
  API_END();
}